

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigTrans.c
# Opt level: O0

void Saig_ManSetMap2(Aig_Man_t *p,Aig_Obj_t *pOld,int f1,Aig_Obj_t *pNew,int f2)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int nOffset;
  Vec_Int_t *vMap;
  int f2_local;
  Aig_Obj_t *pNew_local;
  int f1_local;
  Aig_Obj_t *pOld_local;
  Aig_Man_t *p_local;
  
  p_00 = (Vec_Int_t *)p->pData2;
  iVar1 = Aig_ManObjNumMax(p);
  iVar1 = f1 * iVar1 + pOld->Id;
  iVar2 = Aig_IsComplement(pOld);
  if (iVar2 != 0) {
    __assert_fail("!Aig_IsComplement(pOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigTrans.c"
                  ,0x7c,"void Saig_ManSetMap2(Aig_Man_t *, Aig_Obj_t *, int, Aig_Obj_t *, int)");
  }
  iVar2 = Aig_IsComplement(pNew);
  if (iVar2 == 0) {
    Vec_IntWriteEntry(p_00,iVar1 * 2,pNew->Id);
    Vec_IntWriteEntry(p_00,iVar1 * 2 + 1,f2);
    return;
  }
  __assert_fail("!Aig_IsComplement(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigTrans.c"
                ,0x7d,"void Saig_ManSetMap2(Aig_Man_t *, Aig_Obj_t *, int, Aig_Obj_t *, int)");
}

Assistant:

static inline void Saig_ManSetMap2( Aig_Man_t * p, Aig_Obj_t * pOld, int f1, Aig_Obj_t * pNew, int f2 ) 
{
    Vec_Int_t * vMap = (Vec_Int_t *)p->pData2;
    int nOffset = f1 * Aig_ManObjNumMax(p) + pOld->Id;
    assert( !Aig_IsComplement(pOld) );
    assert( !Aig_IsComplement(pNew) );
    Vec_IntWriteEntry( vMap, 2*nOffset + 0, pNew->Id );
    Vec_IntWriteEntry( vMap, 2*nOffset + 1, f2 );
}